

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O2

void __thiscall
lddgraph::lddrecurse
          (lddgraph *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alreadyscanned,ofstream *gvstream)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  pointer pbVar8;
  size_type sVar9;
  string temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libraries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  value_type local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  ofstream *local_158;
  ulong local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_128 [8];
  ulong local_120;
  lddgraph *local_108;
  string *local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  long local_e8;
  pointer local_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = gvstream;
  if (this->_quiet == false) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Scanning file ");
    poVar5 = std::operator<<(poVar5,(string *)file);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ldd(this,file,&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(alreadyscanned,file);
  local_f0 = &this->_ignorelist;
  local_f8 = &this->_ignorepatterns;
  uVar7 = 0;
  local_108 = this;
  local_100 = file;
  do {
    if ((ulong)((long)local_178.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_178.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_178);
      return;
    }
    if ((local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length != 0) &&
       (bVar3 = contains<std::__cxx11::string>
                          (local_f0,local_178.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar7), !bVar3)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c8,local_f8);
      std::__cxx11::string::string
                (local_90,(string *)
                          (local_178.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar7));
      local_e0 = local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pbVar8 = local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_150 = uVar7;
      local_e8 = uVar7 * 0x20;
      while( true ) {
        lVar6 = local_e8;
        uVar7 = local_150;
        if (pbVar8 == local_e0) break;
        std::__cxx11::string::string((string *)&local_b0,(string *)pbVar8);
        local_d8 = pbVar8;
        std::__cxx11::string::string(local_128,local_90);
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_198._M_string_length = 0;
        local_198.field_2._M_local_buf[0] = '\0';
        bVar3 = std::operator==(&local_b0,"*");
        sVar1 = local_b0._M_string_length;
        _Var2._M_p = local_b0._M_dataplus._M_p;
        if (bVar3) {
LAB_00105c9f:
          std::__cxx11::string::~string((string *)&local_198);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_148);
          std::__cxx11::string::~string(local_128);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string(local_90);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_c8);
          uVar7 = local_150;
          goto LAB_00105cf7;
        }
        if (local_b0._M_string_length - 1 <= local_120) {
          for (sVar9 = 0; sVar1 != sVar9; sVar9 = sVar9 + 1) {
            if ((_Var2._M_p[sVar9] == '*') ||
               (std::__cxx11::string::push_back((char)&local_198), _Var2._M_p[sVar9] == '*')) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_148,&local_198);
              std::__cxx11::string::assign((char *)&local_198);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,&local_198);
          pbVar8 = local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_d0 = local_148.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if ((local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
            pbVar8 = local_148.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)local_128);
            bVar3 = std::operator!=(pbVar8,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar3) goto LAB_00105b98;
          }
          uVar7 = local_120;
          bVar3 = false;
          while( true ) {
            if ((pbVar8 == local_d0) ||
               (std::__cxx11::string::_M_assign((string *)&local_198),
               sVar1 = local_198._M_string_length, local_198._M_string_length == 0))
            goto LAB_00105c9f;
            for (lVar6 = 0; lVar6 + sVar1 < uVar7; lVar6 = lVar6 + 1) {
              std::__cxx11::string::substr((ulong)&local_50,(ulong)local_128);
              _Var4 = std::operator==(&local_198,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              if (_Var4) {
                bVar3 = true;
                std::__cxx11::string::erase((ulong)local_128,0);
                goto LAB_00105c96;
              }
            }
            if (!bVar3) break;
LAB_00105c96:
            pbVar8 = pbVar8 + 1;
          }
        }
LAB_00105b98:
        std::__cxx11::string::~string((string *)&local_198);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_148);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string((string *)&local_b0);
        pbVar8 = local_d8 + 1;
      }
      std::__cxx11::string::~string(local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      poVar5 = std::operator<<((ostream *)local_158,"\t\"");
      poVar5 = std::operator<<(poVar5,(string *)local_100);
      poVar5 = std::operator<<(poVar5,"\" -> \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((long)&((local_178.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar6));
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar3 = contains<std::__cxx11::string>
                        (alreadyscanned,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_178.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar6));
      if (!bVar3) {
        std::__cxx11::string::string
                  ((string *)&local_70,
                   (string *)
                   ((long)&((local_178.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6))
        ;
        lddrecurse(local_108,&local_70,alreadyscanned,local_158);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
LAB_00105cf7:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void lddrecurse(string file, vector<string> & alreadyscanned,
        ofstream & gvstream)
    {
      if (!_quiet)
        cout << "Scanning file " << file << endl;
      vector<string> libraries;
      ldd(file, libraries);
      alreadyscanned.push_back(file);
      for (int i = 0; i < libraries.size(); i++)
      {
        if (libraries[i].size() == 0 || contains(_ignorelist, libraries[i])
            || wildcardcontains(_ignorepatterns, libraries[i]))
          continue;
        gvstream << "\t\"" << file << "\" -> \"" << libraries[i] << "\""
            << endl;
        if (contains(alreadyscanned, libraries[i]))
          continue;
        lddrecurse(libraries[i], alreadyscanned, gvstream);
      }
    }